

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
* pstore::index::details::linear_node::get_node
            (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
             *__return_storage_ptr__,database *db,index_pointer node)

{
  linear_node *addr_00;
  bool bVar1;
  element_type *peVar2;
  size_t size;
  element_type *peVar3;
  element_type *local_98;
  linear_node *p;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  shared_ptr<const_pstore::index::details::linear_node> ln;
  undefined1 local_50 [24];
  size_t in_store_size;
  typed_address<pstore::index::details::linear_node> addr;
  __uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_> local_28;
  linear_node *ptr;
  database *db_local;
  index_pointer node_local;
  
  ptr = (linear_node *)db;
  db_local = (database *)node;
  node_local = (index_pointer)__return_storage_ptr__;
  bVar1 = index_pointer::is_heap((index_pointer *)&db_local);
  if (bVar1) {
    local_28._M_t.
    super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
    .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
         (tuple<pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
         index_pointer::untag<pstore::index::details::linear_node_const*,void>
                   ((index_pointer *)&db_local);
    bVar1 = std::operator==((array<unsigned_char,_8UL> *)
                            local_28._M_t.
                            super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
                            .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl,
                            (array<unsigned_char,_8UL> *)&node_signature_);
    if (!bVar1) {
      assert_failed("ptr->signature_ == node_signature_",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                    ,0x7d);
    }
    addr.a_.a_ = (address)0;
    std::
    pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
    ::pair<std::nullptr_t,_const_pstore::index::details::linear_node_*&,_true>
              (__return_storage_ptr__,(void **)&addr,(linear_node **)&stack0xffffffffffffffd8);
  }
  else {
    in_store_size =
         (size_t)index_pointer::untag_address<pstore::index::details::linear_node,void>
                           ((index_pointer *)&db_local);
    database::getro<pstore::index::details::linear_node,void>
              ((database *)local_50,(typed_address<pstore::index::details::linear_node>)ptr);
    peVar2 = std::
             __shared_ptr_access<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    size = linear_node::size(peVar2);
    peVar3 = (element_type *)size_bytes(size);
    std::shared_ptr<const_pstore::index::details::linear_node>::~shared_ptr
              ((shared_ptr<const_pstore::index::details::linear_node> *)local_50);
    addr_00 = ptr;
    local_50._16_8_ = peVar3;
    p = (linear_node *)
        typed_address<pstore::index::details::linear_node>::to_address
                  ((typed_address<pstore::index::details::linear_node> *)&in_store_size);
    database::getro((database *)local_88,(address)addr_00,(size_t)p);
    std::static_pointer_cast<pstore::index::details::linear_node_const,void_const>
              ((shared_ptr<const_void> *)local_78);
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)local_88);
    peVar2 = std::
             __shared_ptr_access<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_78);
    bVar1 = std::operator!=(&peVar2->signature_,(array<unsigned_char,_8UL> *)&node_signature_);
    if (bVar1) {
      raise<pstore::error_code>(index_corrupt);
    }
    local_98 = std::
               __shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>::
               get((__shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                    *)local_78);
    std::
    pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
    ::pair<const_std::shared_ptr<const_pstore::index::details::linear_node>,_true>
              (__return_storage_ptr__,
               (shared_ptr<const_pstore::index::details::linear_node> *)local_78,&local_98);
    std::shared_ptr<const_pstore::index::details::linear_node>::~shared_ptr
              ((shared_ptr<const_pstore::index::details::linear_node> *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

auto linear_node::get_node (database const & db, index_pointer const node)
                -> std::pair<std::shared_ptr<linear_node const>, linear_node const *> {

                if (node.is_heap ()) {
                    auto const * ptr = node.untag<linear_node const *> ();
                    PSTORE_ASSERT (ptr->signature_ == node_signature_);
                    return {nullptr, ptr};
                }

                // Read an existing node. First work out its size.
                auto const addr = node.untag_address<linear_node> ();
                std::size_t const in_store_size =
                    linear_node::size_bytes (db.getro (addr)->size ());

                // Now access the data block for this linear node. We need to use the "raw address"
                // version of getro() because in_store_size is a number of bytes, not a number of
                // instances of linear_node.
                auto const ln = std::static_pointer_cast<linear_node const> (
                    db.getro (addr.to_address (), in_store_size));
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (ln->signature_ != node_signature_) {
                    raise (pstore::error_code::index_corrupt);
                }
#endif
                auto const * const p = ln.get ();
                return {std::move (ln), p};
            }